

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

string * __thiscall
mocker::nasm::fmtAddr_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Addr> *addr)

{
  bool bVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong *puVar10;
  size_type *psVar11;
  shared_ptr<mocker::nasm::Addr> *addr_00;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX_00;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX_01;
  shared_ptr<mocker::nasm::Addr> *addr_01;
  shared_ptr<mocker::nasm::Addr> *extraout_RDX_02;
  ulong uVar12;
  string *__str;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  string __str_2;
  shared_ptr<mocker::nasm::NumericConstant> p;
  shared_ptr<mocker::nasm::MemoryAddr> p_2;
  string __str_1;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  ulong local_a8;
  long lStack_a0;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58;
  string local_50;
  
  dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
            ((nasm *)&local_d8,(shared_ptr<mocker::nasm::Addr> *)this);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar12 = *(ulong *)(local_d8._M_dataplus._M_p + 8);
    uVar13 = -uVar12;
    if (0 < (long)uVar12) {
      uVar13 = uVar12;
    }
    uVar15 = 1;
    if (9 < uVar13) {
      uVar8 = uVar13;
      uVar3 = 4;
      do {
        uVar15 = uVar3;
        if (uVar8 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_001a23b5;
        }
        if (uVar8 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_001a23b5;
        }
        if (uVar8 < 10000) goto LAB_001a23b5;
        bVar1 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar3 = uVar15 + 4;
      } while (bVar1);
      uVar15 = uVar15 + 1;
    }
LAB_001a23b5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)uVar15 - (char)((long)uVar12 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar12 >> 0x3f),uVar15,uVar13);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
  dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
            ((nasm *)&local_d8,(shared_ptr<mocker::nasm::Addr> *)this);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(local_d8._M_dataplus._M_p + 8),
               *(long *)(local_d8._M_dataplus._M_p + 0x10) +
               *(long *)(local_d8._M_dataplus._M_p + 8));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
  dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>const&>
            ((nasm *)&local_98,(shared_ptr<mocker::nasm::Addr> *)this);
  lVar9 = local_98;
  if (local_98 == 0) goto LAB_001a28e8;
  local_58 = local_98;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"[","");
  puVar10 = *(ulong **)(local_98 + 8);
  addr_01 = addr_00;
  if (puVar10 != (ulong *)0x0) {
    local_b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 0x10);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
      }
    }
    local_b8 = puVar10;
    fmtAddr_abi_cxx11_(&local_f8,(nasm *)&local_b8,addr_00);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    addr_01 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      addr_01 = extraout_RDX_00;
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      addr_01 = extraout_RDX_01;
    }
  }
  lVar9 = *(long *)(local_98 + 0x18);
  if (lVar9 != 0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
      std::__cxx11::string::append((char *)&local_d8);
      lVar9 = *(long *)(local_98 + 0x18);
      addr_01 = extraout_RDX_02;
    }
    local_60 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 0x20);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
    }
    local_68 = lVar9;
    fmtAddr_abi_cxx11_(&local_50,(nasm *)&local_68,addr_01);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b8 = &local_a8;
    puVar10 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar10) {
      local_a8 = *puVar10;
      lStack_a0 = plVar5[3];
    }
    else {
      local_a8 = *puVar10;
      local_b8 = (ulong *)*plVar5;
    }
    local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
    *plVar5 = (long)puVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar15 = *(uint *)(local_98 + 0x28);
    uVar3 = -uVar15;
    if (0 < (int)uVar15) {
      uVar3 = uVar15;
    }
    uVar14 = 1;
    if (9 < uVar3) {
      uVar12 = (ulong)uVar3;
      uVar4 = 4;
      do {
        uVar14 = uVar4;
        uVar7 = (uint)uVar12;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001a263f;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001a263f;
        }
        if (uVar7 < 10000) goto LAB_001a263f;
        uVar12 = uVar12 / 10000;
        uVar4 = uVar14 + 4;
      } while (99999 < uVar7);
      uVar14 = uVar14 + 1;
    }
LAB_001a263f:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)uVar14 - (char)((int)uVar15 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_88),uVar14,uVar3);
    uVar12 = (long)&local_b0->_vptr__Sp_counted_base + local_80;
    uVar13 = 0xf;
    if (local_b8 != &local_a8) {
      uVar13 = local_a8;
    }
    if (uVar13 < uVar12) {
      uVar13 = 0xf;
      if (local_88 != local_78) {
        uVar13 = local_78[0];
      }
      if (uVar13 < uVar12) goto LAB_001a26c4;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_001a26c4:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_88);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar11 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8.field_2._8_8_ = puVar6[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar11;
      local_f8._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_f8._M_string_length = puVar6[1];
    *puVar6 = psVar11;
    puVar6[1] = 0;
    *(undefined1 *)psVar11 = 0;
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
  }
  uVar15 = *(uint *)(local_98 + 0x30);
  if (uVar15 != 0) {
    if (0 < (int)uVar15) {
      std::__cxx11::string::append((char *)&local_d8);
      uVar15 = *(uint *)(local_98 + 0x30);
    }
    uVar3 = -uVar15;
    if (0 < (int)uVar15) {
      uVar3 = uVar15;
    }
    uVar14 = 1;
    if (9 < uVar3) {
      uVar12 = (ulong)uVar3;
      uVar4 = 4;
      do {
        uVar14 = uVar4;
        uVar7 = (uint)uVar12;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001a2841;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001a2841;
        }
        if (uVar7 < 10000) goto LAB_001a2841;
        uVar12 = uVar12 / 10000;
        uVar4 = uVar14 + 4;
      } while (99999 < uVar7);
      uVar14 = uVar14 + 1;
    }
LAB_001a2841:
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar14 - (char)((int)uVar15 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_f8._M_dataplus._M_p + (uVar15 >> 0x1f),uVar14,uVar3);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_d8._M_dataplus._M_p,
             local_d8._M_dataplus._M_p + (long)(_func_int ***)local_d8._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar9 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    lVar9 = local_58;
  }
LAB_001a28e8:
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (lVar9 == 0) {
    dyc<mocker::nasm::Label,std::shared_ptr<mocker::nasm::Addr>const&>
              ((nasm *)&local_d8,(shared_ptr<mocker::nasm::Addr> *)this);
    _Var2._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(local_d8._M_dataplus._M_p + 8),
                 *(long *)(local_d8._M_dataplus._M_p + 0x10) +
                 *(long *)(local_d8._M_dataplus._M_p + 8));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                ((nasm *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)this);
      _Var2._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::operator+(&local_d8,"[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_f8._M_dataplus._M_p + 8));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar11 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar11) {
          lVar9 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                      ,0x35,"std::string mocker::nasm::fmtAddr(const std::shared_ptr<Addr> &)");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtAddr(const std::shared_ptr<Addr> &addr) {
  if (auto p = dyc<NumericConstant>(addr))
    return std::to_string(p->getVal());
  if (auto p = dyc<Register>(addr))
    return p->getIdentifier();
  if (auto p = dyc<MemoryAddr>(addr)) {
    std::string res = "[";
    if (p->getReg1())
      res += fmtAddr(p->getReg1());
    if (p->getReg2()) {
      if (res.size() != 1)
        res += "+";
      res += fmtAddr(p->getReg2()) + "*" + std::to_string(p->getScale());
    }
    if (p->getNumber() != 0) {
      if (p->getNumber() > 0)
        res += "+";
      res += std::to_string(p->getNumber());
    }
    return res + "]";
  }
  if (auto p = dyc<Label>(addr)) {
    return p->getName();
  }
  if (auto p = dyc<LabelAddr>(addr)) {
    return "[" + p->getLabelName() + "]";
  }
  assert(false);
}